

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isValidDiagonal(Earcut<unsigned_int> *this,Node *a,Node *b)

{
  bool bVar1;
  double dVar2;
  
  if (((a->next->i != b->i) && (a->prev->i != b->i)) &&
     (bVar1 = intersectsPolygon(this,a,b), !bVar1)) {
    bVar1 = locallyInside(this,a,b);
    if (((bVar1) && (bVar1 = locallyInside(this,b,a), bVar1)) &&
       (bVar1 = middleInside(this,a,b), bVar1)) {
      dVar2 = area(this,a->prev,a,b->prev);
      if (dVar2 != 0.0) {
        return true;
      }
      if (NAN(dVar2)) {
        return true;
      }
      dVar2 = area(this,a,b->prev,b);
      if (dVar2 != 0.0) {
        return true;
      }
      if (NAN(dVar2)) {
        return true;
      }
    }
    if ((a->x == b->x) && (!NAN(a->x) && !NAN(b->x))) {
      if ((a->y == b->y) &&
         ((!NAN(a->y) && !NAN(b->y) && (dVar2 = area(this,a->prev,a,a->next), 0.0 < dVar2)))) {
        dVar2 = area(this,b->prev,b,b->next);
        return 0.0 < dVar2;
      }
    }
  }
  return false;
}

Assistant:

bool Earcut<N>::isValidDiagonal(Node* a, Node* b) {
    return a->next->i != b->i && a->prev->i != b->i && !intersectsPolygon(a, b) && // dones't intersect other edges
           ((locallyInside(a, b) && locallyInside(b, a) && middleInside(a, b) && // locally visible
            (area(a->prev, a, b->prev) != 0.0 || area(a, b->prev, b) != 0.0)) || // does not create opposite-facing sectors
            (equals(a, b) && area(a->prev, a, a->next) > 0 && area(b->prev, b, b->next) > 0)); // special zero-length case
}